

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManRefinePrint(Ga2_Man_t *p,Vec_Int_t *vVec)

{
  Gia_Man_t *pGVar1;
  uint i;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  char *pcVar6;
  
  puts("\n         Unsat core: ");
  i = 0;
  do {
    if (vVec->nSize <= (int)i) {
      return;
    }
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(vVec,i);
    pGVar5 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      return;
    }
    Ga2_ObjLeaves(p->pGia,pGVar5);
    printf("%12d : ",(ulong)i);
    uVar3 = Gia_ObjId(p->pGia,pGVar5);
    printf("Obj =%6d ",(ulong)uVar3);
    iVar2 = Gia_ObjIsRo(p->pGia,pGVar5);
    pcVar6 = "ff ";
    if (iVar2 == 0) {
      pcVar6 = "   ";
    }
    printf(pcVar6);
    iVar2 = Ga2_ObjIsAbs0(p,pGVar5);
    pcVar6 = "a ";
    if (iVar2 == 0) {
      iVar2 = Ga2_ObjIsLeaf0(p,pGVar5);
      pcVar6 = "l ";
      if (iVar2 == 0) {
        pcVar6 = "  ";
      }
    }
    printf(pcVar6);
    printf("Fanins: ");
    for (iVar2 = 0; iVar2 < Ga2_ObjLeaves::v.nSize; iVar2 = iVar2 + 1) {
      pGVar1 = p->pGia;
      iVar4 = Vec_IntEntry(&Ga2_ObjLeaves::v,iVar2);
      pGVar5 = Gia_ManObj(pGVar1,iVar4);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar3 = Gia_ObjId(p->pGia,pGVar5);
      printf("%6d ",(ulong)uVar3);
      iVar4 = Gia_ObjIsRo(p->pGia,pGVar5);
      pcVar6 = "ff ";
      if (iVar4 == 0) {
        pcVar6 = "   ";
      }
      printf(pcVar6);
      iVar4 = Ga2_ObjIsAbs0(p,pGVar5);
      pcVar6 = "a ";
      if (iVar4 == 0) {
        iVar4 = Ga2_ObjIsLeaf0(p,pGVar5);
        pcVar6 = "l ";
        if (iVar4 == 0) {
          pcVar6 = "  ";
        }
      }
      printf(pcVar6);
    }
    putchar(10);
    i = i + 1;
  } while( true );
}

Assistant:

void Ga2_ManRefinePrint( Ga2_Man_t * p, Vec_Int_t * vVec )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    printf( "\n         Unsat core: \n" );
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
    {
        Vec_Int_t * vLeaves = Ga2_ObjLeaves( p->pGia, pObj );
        printf( "%12d : ", i );
        printf( "Obj =%6d ", Gia_ObjId(p->pGia, pObj) );
        if ( Gia_ObjIsRo(p->pGia, pObj) )
            printf( "ff " );
        else
            printf( "   " );
        if ( Ga2_ObjIsAbs0(p, pObj) )
            printf( "a " );
        else if ( Ga2_ObjIsLeaf0(p, pObj) )
            printf( "l " );
        else 
            printf( "  " );
        printf( "Fanins: " );
        Gia_ManForEachObjVec( vLeaves, p->pGia, pFanin, k )
        {
            printf( "%6d ", Gia_ObjId(p->pGia, pFanin) );
            if ( Gia_ObjIsRo(p->pGia, pFanin) )
                printf( "ff " );
            else
                printf( "   " );
            if ( Ga2_ObjIsAbs0(p, pFanin) )
                printf( "a " );
            else if ( Ga2_ObjIsLeaf0(p, pFanin) )
                printf( "l " );
            else
                printf( "  " );
        }
        printf( "\n" );
    }
}